

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_template_checker.cpp
# Opt level: O1

void __thiscall
validation_layer::validationCheckerTemplate::validationCheckerTemplate
          (validationCheckerTemplate *this)

{
  pointer *pppvVar1;
  iterator __position;
  int iVar2;
  char *__s2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  context_t *pcVar5;
  validationChecker *local_18;
  
  this->enableValidationCheckerTemplate = false;
  __s2 = getenv("ZEL_ENABLE_VALIDATION_CHECKER_TEMPLATE");
  if ((__s2 == (char *)0x0) || (iVar2 = strcmp("0",__s2), iVar2 == 0)) {
    this->enableValidationCheckerTemplate = false;
    return;
  }
  iVar2 = strcmp("1",__s2);
  this->enableValidationCheckerTemplate = iVar2 == 0;
  if (iVar2 != 0) {
    return;
  }
  puVar3 = (undefined8 *)operator_new(8);
  *puVar3 = &PTR_zeInitPrologue_001fe260;
  puVar4 = (undefined8 *)operator_new(8);
  *puVar4 = &PTR_zesInitPrologue_001fef48;
  DAT_00201608 = (undefined8 *)operator_new(8);
  *DAT_00201608 = &PTR_zetModuleGetDebugInfoPrologue_001ff8d0;
  templateChecker = puVar3;
  DAT_00201600 = puVar4;
  pcVar5 = context_t::getInstance();
  local_18 = (validationChecker *)&templateChecker;
  __position._M_current =
       (pcVar5->validationHandlers).
       super__Vector_base<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current !=
      (pcVar5->validationHandlers).
      super__Vector_base<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    *__position._M_current = (validationChecker *)&templateChecker;
    pppvVar1 = &(pcVar5->validationHandlers).
                super__Vector_base<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppvVar1 = *pppvVar1 + 1;
    return;
  }
  std::
  vector<validation_layer::validationChecker*,std::allocator<validation_layer::validationChecker*>>
  ::_M_realloc_insert<validation_layer::validationChecker*>
            ((vector<validation_layer::validationChecker*,std::allocator<validation_layer::validationChecker*>>
              *)&pcVar5->validationHandlers,__position,&local_18);
  return;
}

Assistant:

validationCheckerTemplate::validationCheckerTemplate() {
        enableValidationCheckerTemplate = getenv_tobool( "ZEL_ENABLE_VALIDATION_CHECKER_TEMPLATE" );
        if(enableValidationCheckerTemplate) {
            validationCheckerTemplate::ZEvalidationCheckerTemplate *zeChecker = new validationCheckerTemplate::ZEvalidationCheckerTemplate;
            validationCheckerTemplate::ZESvalidationCheckerTemplate *zesChecker = new validationCheckerTemplate::ZESvalidationCheckerTemplate;
            validationCheckerTemplate::ZETvalidationCheckerTemplate *zetChecker = new validationCheckerTemplate::ZETvalidationCheckerTemplate;
            templateChecker.zeValidation = zeChecker;
            templateChecker.zetValidation = zetChecker;
            templateChecker.zesValidation = zesChecker;
            validation_layer::context.getInstance().validationHandlers.push_back(&templateChecker);
        }
    }